

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polyroot.c
# Opt level: O2

void POLYEV(int NN,double *SR,double *SI,double *PR,double *PI,double *QR,double *QI,double *PVR,
           double *PVI)

{
  long lVar1;
  double dVar2;
  double dVar3;
  
  *QR = *PR;
  *QI = *PI;
  *PVR = *QR;
  dVar2 = *QI;
  *PVI = dVar2;
  for (lVar1 = 1; lVar1 < NN; lVar1 = lVar1 + 1) {
    dVar3 = (*PVR * *SR - *SI * dVar2) + PR[lVar1];
    *PVI = *PVR * *SI + *SR * dVar2 + PI[lVar1];
    *PVR = dVar3;
    QR[lVar1] = dVar3;
    dVar2 = *PVI;
    QI[lVar1] = dVar2;
  }
  return;
}

Assistant:

static void POLYEV(int NN, double *SR, double *SI,double *PR, double *PI, double *QR, double *QI, double *PVR, double *PVI) {
	double T;
	int i;
	QR[0] = PR[0];
	QI[0] = PI[0];
	*PVR = QR[0];
	*PVI = QI[0];

	for (i = 1; i < NN; ++i) {
		T = *PVR * *SR - *PVI * *SI + PR[i];
		*PVI = *PVR * *SI + *PVI * *SR + PI[i];
		*PVR = T;
		QR[i] = *PVR;
		QI[i] = *PVI;
	}
}